

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListDoubleAddPairLast(Fxu_Double *pDiv,Fxu_Pair *pLink)

{
  Fxu_ListPair *pList;
  Fxu_Pair *pLink_local;
  Fxu_Double *pDiv_local;
  
  if ((pDiv->lPairs).pHead == (Fxu_Pair *)0x0) {
    (pDiv->lPairs).pHead = pLink;
    (pDiv->lPairs).pTail = pLink;
    pLink->pDPrev = (Fxu_Pair *)0x0;
    pLink->pDNext = (Fxu_Pair *)0x0;
  }
  else {
    pLink->pDNext = (Fxu_Pair *)0x0;
    ((pDiv->lPairs).pTail)->pDNext = pLink;
    pLink->pDPrev = (pDiv->lPairs).pTail;
    (pDiv->lPairs).pTail = pLink;
  }
  (pDiv->lPairs).nItems = (pDiv->lPairs).nItems + 1;
  return;
}

Assistant:

void Fxu_ListDoubleAddPairLast( Fxu_Double * pDiv, Fxu_Pair * pLink )
{
	Fxu_ListPair * pList = &pDiv->lPairs;
	if ( pList->pHead == NULL )
	{
		pList->pHead = pLink;
		pList->pTail = pLink;
		pLink->pDPrev = NULL;
		pLink->pDNext = NULL;
	}
	else
	{
		pLink->pDNext = NULL;
		pList->pTail->pDNext = pLink;
		pLink->pDPrev = pList->pTail;
		pList->pTail = pLink;
	}
	pList->nItems++;
}